

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O0

CallInfo __thiscall
Js::JavascriptStackWalker::GetCallInfo(JavascriptStackWalker *this,bool includeInlinedFrames)

{
  code *pcVar1;
  ulong uVar2;
  bool bVar3;
  CallFlags CVar4;
  undefined4 *puVar5;
  JavascriptFunction *this_00;
  FunctionInfo *this_01;
  JavascriptGenerator *this_02;
  Arguments *pAVar6;
  void **ppvVar7;
  JavascriptGenerator *gen;
  bool includeInlinedFrames_local;
  JavascriptStackWalker *this_local;
  CallInfo callInfo;
  
  bVar3 = IsJavascriptFrame(this);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                ,0x435,"(this->IsJavascriptFrame())","this->IsJavascriptFrame()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  CallInfo::CallInfo((CallInfo *)&this_local);
  if ((includeInlinedFrames) && ((*(ushort *)&this->field_0x50 & 1) != 0)) {
    this_local = *(JavascriptStackWalker **)&this->inlinedFrameCallInfo;
  }
  else {
    this_00 = GetCurrentFunction(this,true);
    this_01 = JavascriptFunction::GetFunctionInfo(this_00);
    bVar3 = FunctionInfo::IsCoroutine(this_01);
    if (bVar3) {
      ppvVar7 = GetCurrentArgv(this);
      this_02 = VarTo<Js::JavascriptGenerator>(ppvVar7[2]);
      pAVar6 = JavascriptGenerator::GetArguments(this_02);
      this_local = *(JavascriptStackWalker **)&pAVar6->Info;
    }
    else if ((*(ushort *)&this->field_0x50 >> 3 & 1) == 0) {
      ppvVar7 = GetCurrentArgv(this);
      this_local = (JavascriptStackWalker *)ppvVar7[1];
    }
    else {
      this_local = *(JavascriptStackWalker **)&this->prevNativeLibraryEntry->callInfo;
    }
  }
  CVar4 = Js::operator&((CallFlags)((ulong)this_local >> 0x18) &
                        (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|
                         CallFlags_NotUsed|CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|
                        CallFlags_New),CallFlags_ExtraArg);
  if (CVar4 != CallFlags_None) {
    uVar2 = (ulong)this_local >> 0x18;
    CVar4 = operator~(CallFlags_ExtraArg);
    CVar4 = Js::operator&((CallFlags)uVar2 &
                          (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|
                           CallFlags_NotUsed|CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|
                          CallFlags_New),CVar4);
    this_local = (JavascriptStackWalker *)
                 ((ulong)this_local & 0xffffffff00ffffff | ((ulong)CVar4 & 0xff) << 0x18);
  }
  return (CallInfo)this_local;
}

Assistant:

CallInfo JavascriptStackWalker::GetCallInfo(bool includeInlinedFrames /* = true */) const
    {
        Assert(this->IsJavascriptFrame());
        CallInfo callInfo;
        if (includeInlinedFrames && inlinedFramesBeingWalked)
        {
            // Since we don't support inlining constructors yet, its questionable if we should handle the
            // hidden frame display here?
            callInfo = inlinedFrameCallInfo;
        }
        else if (this->GetCurrentFunction()->GetFunctionInfo()->IsCoroutine())
        {
            JavascriptGenerator* gen = VarTo<JavascriptGenerator>(this->GetCurrentArgv()[JavascriptFunctionArgIndex_This]);
            callInfo = gen->GetArguments().Info;
        }
        else if (this->isNativeLibraryFrame)
        {
            // Return saved callInfo. Do not read from stack as compiler may stackpack/optimize args.
            callInfo = this->prevNativeLibraryEntry->callInfo;
        }
        else
        {
            callInfo = *(CallInfo const *)&this->GetCurrentArgv()[JavascriptFunctionArgIndex_CallInfo];
        }

        if (callInfo.Flags & Js::CallFlags_ExtraArg)
        {
            callInfo.Flags = (CallFlags)(callInfo.Flags & ~Js::CallFlags_ExtraArg);
        }

        return callInfo;
    }